

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::listenerThread(Game *this)

{
  GameData *this_00;
  long *plVar1;
  Connection *this_01;
  int port;
  SOCKET connection_id;
  Configuration *this_02;
  shared_ptr<Connection> connection;
  ServerSocket socket;
  DataSocket dataSocket;
  Connection *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  ServerSocket local_9c;
  undefined1 local_90 [40];
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_68;
  DataSocket local_58;
  
  this_02 = GameData::GetConfiguration
                      ((this->m_game_data).super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  port = Configuration::GetPort(this_02);
  ServerSocket::ServerSocket(&local_9c,port);
  ServerSocket::Listen(&local_9c);
  local_90._16_8_ = &this->m_game_data;
  while (this->isRunning == true) {
    ServerSocket::Accept(&local_58,&local_9c);
    std::make_shared<Connection,DataSocket&>((DataSocket *)&local_b0);
    local_90._0_2_ = 0;
    Connection::SetState(local_b0,(GameStates *)local_90,(shared_ptr<GameData> *)local_90._16_8_);
    Connection::GetState((Connection *)local_90);
    plVar1 = (long *)CONCAT62(local_90._2_6_,local_90._0_2_);
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)&local_b0);
    (**(code **)(*plVar1 + 8))(plVar1,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    Connection::ResetStateChanged(local_b0);
    std::mutex::lock(&game_mutex);
    this_01 = local_b0;
    connection_id = Connection::GetSocket(local_b0);
    Connection::SetID(this_01,connection_id);
    this->connection_id = this->connection_id + 1;
    this_00 = (this->m_game_data).super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18),
               (__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)&local_b0);
    GameData::AddConnection(this_00,(shared_ptr<Connection> *)(local_90 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x20));
    Connection::Run(local_b0);
    pthread_mutex_unlock((pthread_mutex_t *)&game_mutex);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
    DataSocket::~DataSocket(&local_58);
  }
  ServerSocket::~ServerSocket(&local_9c);
  return;
}

Assistant:

void Game::listenerThread() {
    ServerSocket socket(m_game_data->GetConfiguration().GetPort());
    socket.Listen();
    while(isRunning) {
        DataSocket dataSocket = socket.Accept();
        auto connection = std::make_shared<Connection>(dataSocket);
        connection->SetState(GameStates::LOGIN, m_game_data);
        connection->GetState()->init(connection);
        connection->ResetStateChanged();
        std::lock_guard<std::mutex> guard(Game::game_mutex);
        // TODO: connection_id temporary for debugging
        // TODO: eventually connection_id could increment beyond the size of int
        connection->SetID(connection->GetSocket());
        ++connection_id;
        m_game_data->AddConnection(connection);
        connection->Run();
    }
}